

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_add_input_at(wally_tx *tx,uint32_t index,wally_tx_input *input)

{
  _Bool _Var1;
  wally_tx_input *pwVar2;
  wally_tx_input *p;
  wally_tx_input *input_local;
  uint32_t index_local;
  wally_tx *tx_local;
  
  _Var1 = is_valid_tx(tx);
  if (((_Var1) && ((ulong)index <= tx->num_inputs)) && (_Var1 = is_valid_tx_input(input), _Var1)) {
    if (tx->inputs_allocation_len <= tx->num_inputs) {
      pwVar2 = (wally_tx_input *)
               realloc_array(tx->inputs,tx->inputs_allocation_len,tx->num_inputs + 1,0xd0);
      if (pwVar2 == (wally_tx_input *)0x0) {
        return -3;
      }
      clear_and_free(tx->inputs,tx->num_inputs * 0xd0);
      tx->inputs = pwVar2;
      tx->inputs_allocation_len = tx->inputs_allocation_len + 1;
    }
    memmove(tx->inputs + (ulong)index + 1,tx->inputs + index,(tx->num_inputs - (ulong)index) * 0xd0)
    ;
    _Var1 = clone_input_to(tx->inputs + index,input);
    if (_Var1) {
      tx->num_inputs = tx->num_inputs + 1;
      tx_local._4_4_ = 0;
    }
    else {
      memmove(tx->inputs + index,tx->inputs + (ulong)index + 1,
              (tx->num_inputs - (ulong)index) * 0xd0);
      tx_local._4_4_ = -3;
    }
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_add_input_at(struct wally_tx *tx, uint32_t index,
                          const struct wally_tx_input *input)
{
    if (!is_valid_tx(tx) || index > tx->num_inputs || !is_valid_tx_input(input))
        return WALLY_EINVAL;

    if (tx->num_inputs >= tx->inputs_allocation_len) {
        /* Expand the inputs array */
        struct wally_tx_input *p;
        p = realloc_array(tx->inputs, tx->inputs_allocation_len,
                          tx->num_inputs + 1, sizeof(*tx->inputs));
        if (!p)
            return WALLY_ENOMEM;

        clear_and_free(tx->inputs, tx->num_inputs * sizeof(*tx->inputs));
        tx->inputs = p;
        tx->inputs_allocation_len += 1;
    }

    memmove(tx->inputs + index + 1, tx->inputs + index,
            (tx->num_inputs - index) * sizeof(*input));

    if (!clone_input_to(tx->inputs + index, input)) {
        memmove(tx->inputs + index, tx->inputs + index + 1,
                (tx->num_inputs - index) * sizeof(*input)); /* Undo */
        return WALLY_ENOMEM;
    }

    tx->num_inputs += 1;
    return WALLY_OK;
}